

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles2::Functional::ShaderSourceReplaceCase::readSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderSourceReplaceCase *this,Shader *shader)

{
  pointer pcVar1;
  GLint GVar2;
  size_t sVar3;
  char *pcVar4;
  vector<char,_std::allocator<char>_> sourceBuffer;
  allocator_type local_39;
  vector<char,_std::allocator<char>_> local_38;
  
  GVar2 = getSourceLength(this,shader);
  std::vector<char,_std::allocator<char>_>::vector(&local_38,(long)(GVar2 + 1),&local_39);
  glu::CallLogWrapper::glGetShaderSource
            (&(this->super_ApiCase).super_CallLogWrapper,shader->m_shader,
             (int)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
             (int)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,(GLsizei *)0x0,
             local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  pcVar1 = local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start == (char *)0x0) {
    pcVar4 = &DAT_00000001;
  }
  else {
    sVar3 = strlen(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    pcVar4 = pcVar1 + sVar3;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar1,pcVar4);
  if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string readSource (glu::Shader& shader)
	{
		const GLint			sourceLength	= getSourceLength(shader);
		std::vector<char>	sourceBuffer	(sourceLength + 1);

		glGetShaderSource(shader.getShader(), (GLsizei)sourceBuffer.size(), 0, &sourceBuffer[0]);

		return std::string(&sourceBuffer[0]);
	}